

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EigenDecompositionCube.hpp
# Opt level: O1

void __thiscall
beagle::cpu::EigenDecompositionCube<double,_1>::EigenDecompositionCube
          (EigenDecompositionCube<double,_1> *this,int decompositionCount,int stateCount,
          int categoryCount,long flags)

{
  double **ppdVar1;
  double *pdVar2;
  undefined8 *puVar3;
  ulong uVar4;
  long lVar5;
  size_t __size;
  
  (this->super_EigenDecomposition<double,_1>).kEigenDecompCount = decompositionCount;
  (this->super_EigenDecomposition<double,_1>).kStateCount = stateCount;
  (this->super_EigenDecomposition<double,_1>).kCategoryCount = categoryCount;
  (this->super_EigenDecomposition<double,_1>).kFlags = flags;
  (this->super_EigenDecomposition<double,_1>)._vptr_EigenDecomposition =
       (_func_int **)&PTR__EigenDecompositionCube_0014cc70;
  ppdVar1 = (double **)malloc((long)decompositionCount << 3);
  (this->super_EigenDecomposition<double,_1>).gEigenValues = ppdVar1;
  if (ppdVar1 != (double **)0x0) {
    ppdVar1 = (double **)malloc((long)decompositionCount << 3);
    this->gCMatrices = ppdVar1;
    if (ppdVar1 != (double **)0x0) {
      lVar5 = (long)stateCount;
      if (0 < decompositionCount) {
        uVar4 = 0;
        do {
          pdVar2 = (double *)malloc(lVar5 * lVar5 * lVar5 * 8);
          this->gCMatrices[uVar4] = pdVar2;
          if (this->gCMatrices[uVar4] == (double *)0x0) goto LAB_0012cc9f;
          pdVar2 = (double *)malloc(lVar5 * 8);
          (this->super_EigenDecomposition<double,_1>).gEigenValues[uVar4] = pdVar2;
          if ((this->super_EigenDecomposition<double,_1>).gEigenValues[uVar4] == (double *)0x0)
          goto LAB_0012cc9f;
          uVar4 = uVar4 + 1;
        } while ((uint)decompositionCount != uVar4);
      }
      __size = lVar5 << 3;
      pdVar2 = (double *)malloc(__size);
      (this->super_EigenDecomposition<double,_1>).matrixTmp = pdVar2;
      pdVar2 = (double *)malloc(__size);
      (this->super_EigenDecomposition<double,_1>).firstDerivTmp = pdVar2;
      pdVar2 = (double *)malloc(__size);
      (this->super_EigenDecomposition<double,_1>).secondDerivTmp = pdVar2;
      return;
    }
  }
LAB_0012cc9f:
  puVar3 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar3 = __cxa_init_primary_exception;
  __cxa_throw(puVar3,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
}

Assistant:

BEAGLE_CPU_EIGEN_TEMPLATE
EigenDecompositionCube<BEAGLE_CPU_EIGEN_GENERIC>::EigenDecompositionCube(int decompositionCount,
											         int stateCount,
											         int categoryCount,
                                                     long flags)
											         : EigenDecomposition<BEAGLE_CPU_EIGEN_GENERIC>(decompositionCount,
																				stateCount,
																				categoryCount,
                                                                                    flags) {
    gEigenValues = (REALTYPE**) malloc(sizeof(REALTYPE*) * kEigenDecompCount);
    if (gEigenValues == NULL)
        throw std::bad_alloc();

    gCMatrices = (REALTYPE**) malloc(sizeof(REALTYPE*) * kEigenDecompCount);
    if (gCMatrices == NULL)
    	throw std::bad_alloc();

    for (int i = 0; i < kEigenDecompCount; i++) {
    	gCMatrices[i] = (REALTYPE*) malloc(sizeof(REALTYPE) * kStateCount * kStateCount * kStateCount);
    	if (gCMatrices[i] == NULL)
    		throw std::bad_alloc();

    	gEigenValues[i] = (REALTYPE*) malloc(sizeof(REALTYPE) * kStateCount);
    	if (gEigenValues[i] == NULL)
    		throw std::bad_alloc();
    }

    matrixTmp = (REALTYPE*) malloc(sizeof(REALTYPE) * kStateCount);
    firstDerivTmp = (REALTYPE*) malloc(sizeof(REALTYPE) * kStateCount);
    secondDerivTmp = (REALTYPE*) malloc(sizeof(REALTYPE) * kStateCount);
}